

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask13_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar2 = in[1] << 0xd | uVar2;
  *out = uVar2;
  uVar1 = in[2];
  *out = uVar1 << 0x1a | uVar2;
  uVar1 = uVar1 >> 6;
  out[1] = uVar1;
  uVar1 = in[3] << 7 | uVar1;
  out[1] = uVar1;
  uVar2 = in[4];
  out[1] = uVar2 << 0x14 | uVar1;
  uVar2 = uVar2 >> 0xc;
  out[2] = uVar2;
  uVar2 = in[5] * 2 | uVar2;
  out[2] = uVar2;
  uVar2 = in[6] << 0xe | uVar2;
  out[2] = uVar2;
  uVar1 = in[7];
  out[2] = uVar1 << 0x1b | uVar2;
  uVar1 = uVar1 >> 5;
  out[3] = uVar1;
  uVar1 = in[8] << 8 | uVar1;
  out[3] = uVar1;
  uVar2 = in[9];
  out[3] = uVar2 << 0x15 | uVar1;
  uVar2 = uVar2 >> 0xb;
  out[4] = uVar2;
  uVar2 = in[10] << 2 | uVar2;
  out[4] = uVar2;
  uVar2 = in[0xb] << 0xf | uVar2;
  out[4] = uVar2;
  uVar1 = in[0xc];
  out[4] = uVar1 << 0x1c | uVar2;
  uVar1 = uVar1 >> 4;
  out[5] = uVar1;
  uVar1 = in[0xd] << 9 | uVar1;
  out[5] = uVar1;
  uVar2 = in[0xe];
  out[5] = uVar2 << 0x16 | uVar1;
  uVar2 = uVar2 >> 10;
  out[6] = uVar2;
  out[6] = in[0xf] << 3 | uVar2;
  return out + 7;
}

Assistant:

uint32_t *__fastpackwithoutmask13_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (13 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (13 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (13 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (13 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (13 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (13 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;

  return out + 1;
}